

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O1

pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> * __thiscall
OpenMD::Ellipsoid::getBoundingBox(Ellipsoid *this)

{
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *boundary;
  uint i;
  long lVar1;
  Vector<double,_3U> result;
  Vector3d r;
  
  (boundary->second).super_Vector<double,_3U>.data_[1] = 0.0;
  (boundary->second).super_Vector<double,_3U>.data_[2] = 0.0;
  (boundary->first).super_Vector<double,_3U>.data_[2] = 0.0;
  (boundary->second).super_Vector<double,_3U>.data_[0] = 0.0;
  (boundary->first).super_Vector<double,_3U>.data_[0] = 0.0;
  (boundary->first).super_Vector<double,_3U>.data_[1] = 0.0;
  r.super_Vector<double,_3U>.data_[0] = this->rAxial_;
  if (this->rAxial_ <= this->rEquatorial_) {
    r.super_Vector<double,_3U>.data_[0] = this->rEquatorial_;
  }
  r.super_Vector<double,_3U>.data_[1] = r.super_Vector<double,_3U>.data_[0];
  r.super_Vector<double,_3U>.data_[2] = r.super_Vector<double,_3U>.data_[0];
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar1 = 0;
  do {
    result.data_[lVar1] =
         (this->origin_).super_Vector<double,_3U>.data_[lVar1] -
         r.super_Vector<double,_3U>.data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (boundary->first).super_Vector<double,_3U>.data_[2] = result.data_[2];
  (boundary->first).super_Vector<double,_3U>.data_[0] = result.data_[0];
  (boundary->first).super_Vector<double,_3U>.data_[1] = result.data_[1];
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar1 = 0;
  do {
    result.data_[lVar1] =
         (this->origin_).super_Vector<double,_3U>.data_[lVar1] +
         r.super_Vector<double,_3U>.data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (boundary->second).super_Vector<double,_3U>.data_[2] = result.data_[2];
  (boundary->second).super_Vector<double,_3U>.data_[0] = result.data_[0];
  (boundary->second).super_Vector<double,_3U>.data_[1] = result.data_[1];
  return boundary;
}

Assistant:

std::pair<Vector3d, Vector3d> Ellipsoid::getBoundingBox() {
    std::pair<Vector3d, Vector3d> boundary;
    // make a cubic box
    RealType rad = rAxial_ > rEquatorial_ ? rAxial_ : rEquatorial_;
    Vector3d r(rad, rad, rad);
    boundary.first  = origin_ - r;
    boundary.second = origin_ + r;
    return boundary;
  }